

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O1

int s_stop(char *s,ftnlen n)

{
  long lVar1;
  
  if (0 < n) {
    fwrite("STOP ",5,1,_stderr);
    lVar1 = 0;
    do {
      putc((int)s[lVar1],_stderr);
      lVar1 = lVar1 + 1;
    } while (n != (int)lVar1);
    fwrite(" statement executed\n",0x14,1,_stderr);
  }
  exit(0);
}

Assistant:

int s_stop(char *s, ftnlen n)
#endif
        {
            int i;

            if (n > 0) {
                fprintf(stderr, "STOP ");
                for (i = 0; i < n; ++i)
                    putc(*s++, stderr);
                fprintf(stderr, " statement executed\n");
            }
#ifdef NO_ONEXIT
            f_exit();
#endif
             exit(0);

/* We cannot avoid (useless) compiler diagnostics here:		*/
/* some compilers complain if there is no return statement,	*/
/* and others complain that this one cannot be reached.		*/

             return 0;          /* NOT REACHED */
        }